

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportInstallFileGenerator *this,string *name,string *config)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  _Base_ptr p_Var4;
  bool bVar5;
  string se;
  string filename_config;
  string local_490;
  string fileName;
  string dest;
  string cxx_modules_dirname;
  ostringstream e;
  cmGeneratedFileStream os;
  
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x16])
            (&cxx_modules_dirname,this);
  if (cxx_modules_dirname._M_string_length == 0) {
    bVar5 = true;
  }
  else {
    std::__cxx11::string::string((string *)&filename_config,(string *)config);
    if (filename_config._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&filename_config);
    }
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_1_ =
         0x2f;
    e = (ostringstream)0x2f;
    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char>
              (&dest,&(this->super_cmExportFileGenerator).FileDir,(char *)&os,&cxx_modules_dirname,
               (char *)&e);
    os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._0_1_ =
         0x2d;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[7]>
              (&fileName,&dest,(char (*) [13])0x6ec915,name,(char *)&os,&filename_config,
               (char (*) [7])0x6a39be);
    cmGeneratedFileStream::cmGeneratedFileStream(&os,&fileName,true,None);
    bVar5 = ((&os.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [*(long *)(CONCAT71(os.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream._1_7_,
                                 os.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream._0_1_) + -0x18)] & 5) == 0;
    if (bVar5) {
      cmGeneratedFileStream::SetCopyIfDifferent(&os,true);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigCxxModuleFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->ConfigCxxModuleTargetFiles,config);
      for (p_Var4 = (this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 !=
          &(this->super_cmExportFileGenerator).ExportedTargets._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        this_00 = *(cmGeneratorTarget **)(p_Var4 + 1);
        bVar1 = cmGeneratorTarget::HaveCxx20ModuleSources(this_00,(string *)0x0);
        if (bVar1) {
          cmGeneratorTarget::GetExportName_abi_cxx11_(&se,this_00);
          local_490._M_dataplus._M_p._0_1_ = 0x2d;
          cmStrCat<char_const(&)[8],std::__cxx11::string,char,std::__cxx11::string&,char_const(&)[7]>
                    ((string *)&e,(char (*) [8])0x6cdf3f,&se,(char *)&local_490,&filename_config,
                     (char (*) [7])0x6a39be);
          std::__cxx11::string::~string((string *)&se);
          cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&>(&se,&dest,(string *)&e);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(this_01,&se);
          std::__cxx11::string::~string((string *)&se);
          poVar2 = std::operator<<((ostream *)&os,"include(\"${CMAKE_CURRENT_LIST_DIR}/");
          poVar2 = std::operator<<(poVar2,(string *)&e);
          std::operator<<(poVar2,"\")\n");
          std::__cxx11::string::~string((string *)&e);
        }
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar2 = std::operator<<((ostream *)&e,"cannot write to file \"");
      poVar2 = std::operator<<(poVar2,(string *)&fileName);
      poVar2 = std::operator<<(poVar2,"\": ");
      std::operator<<(poVar2,(string *)&se);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&se);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&os);
    std::__cxx11::string::~string((string *)&fileName);
    std::__cxx11::string::~string((string *)&dest);
    std::__cxx11::string::~string((string *)&filename_config);
  }
  std::__cxx11::string::~string((string *)&cxx_modules_dirname);
  return bVar5;
}

Assistant:

bool cmExportInstallFileGenerator::
  GenerateImportCxxModuleConfigTargetInclusion(std::string const& name,
                                               std::string const& config)
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  std::string filename_config = config;
  if (filename_config.empty()) {
    filename_config = "noconfig";
  }

  std::string const dest =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, '/');
  std::string fileName =
    cmStrCat(dest, "cxx-modules-", name, '-', filename_config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  // Record this per-config import file.
  this->ConfigCxxModuleFiles[config] = fileName;

  auto& prop_files = this->ConfigCxxModuleTargetFiles[config];
  for (auto const* tgt : this->ExportedTargets) {
    // Only targets with C++ module sources will have a
    // collator-generated install script.
    if (!tgt->HaveCxx20ModuleSources()) {
      continue;
    }

    auto prop_filename = cmStrCat("target-", tgt->GetExportName(), '-',
                                  filename_config, ".cmake");
    prop_files.emplace_back(cmStrCat(dest, prop_filename));
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << prop_filename << "\")\n";
  }

  return true;
}